

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_enc.c
# Opt level: O3

int VP8LGetBackwardReferences
              (int width,int height,uint32_t *argb,int quality,int low_effort,int lz77_types_to_try,
              int cache_bits_max,int do_no_cache,VP8LHashChain *hash_chain,VP8LBackwardRefs *refs,
              int *cache_bits_best,WebPPicture *pic,int percent_range,int *percent)

{
  ushort uVar1;
  ushort uVar2;
  uint32_t uVar3;
  PixOrCopyBlock **ppPVar4;
  PixOrCopyBlock **ppPVar5;
  long *plVar6;
  long lVar7;
  PixOrCopyBlock *pPVar8;
  PixOrCopyBlock **ppPVar9;
  PixOrCopyBlock *pPVar10;
  PixOrCopyBlock *pPVar11;
  PixOrCopyBlock *pPVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  VP8LHashChain VVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  uint uVar23;
  VP8LBackwardRefs *refs_00;
  ulong uVar24;
  void *ptr;
  short *psVar25;
  VP8LColorCache *pVVar26;
  uint64_t uVar27;
  VP8LHistogram *pVVar28;
  uint64_t uVar29;
  long lVar30;
  uint uVar31;
  PixOrCopyBlock **ppPVar32;
  short sVar33;
  uint uVar34;
  uint uVar35;
  VP8LBackwardRefs *pVVar36;
  PixOrCopy *pPVar37;
  VP8LBackwardRefs *pVVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  uint uVar42;
  PixOrCopy v;
  VP8LBackwardRefs *pVVar43;
  uint uVar44;
  uint uVar45;
  VP8LHashChain *hash_chain_00;
  undefined4 in_register_0000008c;
  VP8LBackwardRefs *pVVar46;
  uint uVar47;
  uint32_t *puVar48;
  uint32_t *puVar49;
  PixOrCopy *pPVar50;
  ulong uVar51;
  long lVar52;
  uint uVar53;
  int *piVar54;
  long lVar55;
  ulong uVar56;
  PixOrCopyBlock *pPVar57;
  bool bVar58;
  int lz77_types_best [2];
  int window_offsets [32];
  int cc_init [11];
  PixOrCopyBlock *local_290;
  PixOrCopy *local_278;
  uint local_260;
  uint local_258 [4];
  VP8LHashChain local_248;
  VP8LHistogram *local_230;
  uint32_t *local_228;
  VP8LHashChain *local_220;
  int *local_218;
  int local_210;
  uint local_20c;
  uint64_t local_208;
  WebPPicture *local_200;
  VP8LBackwardRefs *local_1f8;
  PixOrCopyBlock **local_1f0;
  long local_1e8;
  VP8LBackwardRefs *local_1e0;
  undefined4 local_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  long local_1c8;
  long local_1c0;
  long local_1b8;
  int *local_1b0;
  long local_1a8;
  undefined8 local_1a0;
  VP8LColorCache local_198;
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  long lStack_f0;
  VP8LColorCache local_e8;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 auStack_58 [12];
  undefined4 local_4c;
  undefined1 auStack_48 [12];
  
  pVVar46 = (VP8LBackwardRefs *)CONCAT44(in_register_0000008c,lz77_types_to_try);
  if (low_effort == 0) {
    local_218 = cache_bits_best;
    local_220 = hash_chain;
    local_210 = percent_range;
    local_1b0 = percent;
    local_200 = pic;
    local_258[3] = cache_bits_max;
    local_258[0] = 0;
    local_258[1] = 0;
    local_1d8 = 0xffffffff;
    uStack_1d4 = 0xffffffff;
    uStack_1d0 = 0xffffffff;
    uStack_1cc = 0xffffffff;
    local_1a0 = refs + 1;
    refs_00 = refs + 2;
    if (do_no_cache == 0) {
      refs_00 = local_1a0;
    }
    local_248.offset_length = (uint32_t *)0x0;
    local_248.size = 0;
    local_248._12_4_ = 0;
    local_230 = VP8LAllocateHistogram(10);
    if (local_230 == (VP8LHistogram *)0x0) {
LAB_00147566:
      WebPSafeFree(local_248.offset_length);
      local_248.size = 0;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = local_248._8_8_;
      local_248 = (VP8LHashChain)(auVar15 << 0x40);
      VP8LFreeHistogram(local_230);
      iVar17 = WebPEncodingSetError(local_200,VP8_ENC_ERROR_OUT_OF_MEMORY);
      return iVar17;
    }
    if (lz77_types_to_try == 0) {
      local_260 = 0;
      uVar31 = 0;
    }
    else {
      uVar31 = height * width;
      local_208 = (uint64_t)(int)uVar31;
      uVar34 = uVar31 - 2;
      ppPVar32 = &refs_00->refs;
      local_1e8 = -(long)width;
      local_1a8 = (ulong)(uint)width << 0x20;
      uVar56 = (ulong)local_258[3];
      if (quality < 0x1a) {
        uVar56 = 0;
      }
      local_1f0 = &refs->refs;
      iVar17 = (int)uVar56;
      uVar24 = (ulong)(iVar17 + 1);
      local_258[2] = 0x20 - iVar17;
      local_1c0 = (ulong)uVar34 + 1;
      local_1b8 = (long)(int)uVar34;
      local_1c8 = (long)(int)uVar34 * 2 + 2;
      local_1e0 = (VP8LBackwardRefs *)(uVar56 + 1);
      uVar34 = 1;
      do {
        local_20c = lz77_types_to_try;
        if ((uVar34 & lz77_types_to_try) != 0) {
          if (uVar34 == 1) {
            iVar21 = (int)local_220;
LAB_00146be0:
            uVar23 = BackwardReferencesLz77
                               (width,height,argb,iVar21,(VP8LHashChain *)refs_00,pVVar46);
          }
          else if (uVar34 == 4) {
            puVar48 = (uint32_t *)WebPSafeMalloc(local_208,4);
            VVar16 = local_248;
            local_248.offset_length = puVar48;
            if (puVar48 == (uint32_t *)0x0) goto LAB_00147566;
            local_248._12_4_ = VVar16._12_4_;
            local_248.size = (int)local_208;
            local_128 = (undefined1  [16])0x0;
            local_138 = (undefined1  [16])0x0;
            local_148 = (undefined1  [16])0x0;
            local_158 = (undefined1  [16])0x0;
            local_168 = (undefined1  [16])0x0;
            local_178 = (undefined1  [16])0x0;
            local_188 = (undefined1  [16])0x0;
            local_198.colors = (uint32_t *)0x0;
            local_198.hash_shift = 0;
            local_198.hash_bits = 0;
            local_78 = (undefined1  [16])0x0;
            local_88 = (undefined1  [16])0x0;
            local_98 = (undefined1  [16])0x0;
            local_a8 = (undefined1  [16])0x0;
            local_b8 = (undefined1  [16])0x0;
            local_c8 = (undefined1  [16])0x0;
            local_d8 = (undefined1  [16])0x0;
            local_e8.colors = (uint32_t *)0x0;
            local_e8.hash_shift = 0;
            local_e8.hash_bits = 0;
            ptr = WebPSafeMalloc(local_208,2);
            if (ptr != (void *)0x0) {
              *(undefined2 *)((long)ptr + local_1b8 * 2 + 2) = 1;
              if (1 < (int)uVar31) {
                psVar25 = (short *)((long)ptr + local_1c8);
                lVar52 = local_1c0;
                do {
                  sVar33 = 1;
                  if (argb[lVar52 + -1] == argb[lVar52]) {
                    sVar33 = (ushort)(*psVar25 != 0xfff) + *psVar25;
                  }
                  psVar25[-1] = sVar33;
                  psVar25 = psVar25 + -1;
                  lVar55 = lVar52 + -1;
                  bVar58 = 0 < lVar52;
                  lVar52 = lVar55;
                } while (lVar55 != 0 && bVar58);
              }
              iVar22 = 0;
              iVar21 = 0;
              do {
                iVar18 = -6;
                do {
                  iVar19 = iVar22 + iVar18;
                  if ((0 < iVar19) &&
                     (iVar20 = VP8LDistanceToPlaneCode(width,iVar19), iVar20 < 0x21)) {
                    *(int *)((long)&local_1a0 + (long)iVar20 * 4 + 4) = iVar19;
                  }
                  iVar18 = iVar18 + 1;
                } while (iVar18 != 7);
                iVar21 = iVar21 + 1;
                iVar22 = iVar22 + width;
              } while (iVar21 != 7);
              lVar52 = 0;
              pVVar46 = (VP8LBackwardRefs *)0x0;
              do {
                iVar21 = *(int *)((long)&local_198.colors + lVar52 * 4);
                if (iVar21 != 0) {
                  iVar22 = (int)pVVar46;
                  pVVar46 = (VP8LBackwardRefs *)(ulong)(iVar22 + 1);
                  *(int *)((long)&local_198.colors + (long)iVar22 * 4) = iVar21;
                }
                lVar52 = lVar52 + 1;
              } while (lVar52 != 0x20);
              if ((int)pVVar46 < 1) {
                pVVar38 = (VP8LBackwardRefs *)0x0;
              }
              else {
                pVVar36 = (VP8LBackwardRefs *)0x0;
                pVVar38 = (VP8LBackwardRefs *)0x0;
                do {
                  iVar21 = *(int *)((long)&local_198.colors + (long)pVVar36 * 4);
                  pVVar43 = (VP8LBackwardRefs *)0x1;
                  do {
                    iVar22 = *(int *)((long)&local_1a0 + (long)pVVar43 * 4 + 4) + 1;
                    if (pVVar46 <= pVVar43) break;
                    pVVar43 = (VP8LBackwardRefs *)((long)&pVVar43->block_size + 1);
                  } while (iVar21 != iVar22);
                  if (iVar21 != iVar22) {
                    *(int *)((long)&local_e8.colors + (long)(int)pVVar38 * 4) = iVar21;
                    pVVar38 = (VP8LBackwardRefs *)(ulong)((int)pVVar38 + 1);
                  }
                  pVVar36 = (VP8LBackwardRefs *)((long)&pVVar36->block_size + 1);
                } while (pVVar36 != pVVar46);
              }
              *puVar48 = 0;
              if (1 < (int)uVar31) {
                local_228 = local_220->offset_length;
                uVar23 = 0xffffffff;
                uVar40 = 1;
                uVar45 = 0xffffffff;
                do {
                  if (((~local_228[uVar40] & 0xfff) == 0) && (0 < (int)pVVar46)) {
                    uVar47 = local_228[uVar40] >> 0xc;
                    pVVar36 = (VP8LBackwardRefs *)0x0;
                    do {
                      if (uVar47 == *(uint *)((long)&local_198.colors + (long)pVVar36 * 4)) {
                        uVar44 = 0xfff;
                        goto LAB_00146b8f;
                      }
                      pVVar36 = (VP8LBackwardRefs *)((long)&pVVar36->block_size + 1);
                    } while (pVVar46 != pVVar36);
                  }
                  uVar44 = uVar45 - 1;
                  pVVar36 = pVVar38;
                  if (0xffc < uVar45 - 2) {
                    uVar23 = 0;
                    uVar44 = 0;
                    pVVar36 = pVVar46;
                  }
                  uVar47 = uVar23;
                  if (0 < (int)pVVar36) {
                    pVVar43 = (VP8LBackwardRefs *)0x0;
                    do {
                      pVVar26 = &local_198;
                      if (uVar45 - 2 < 0xffd) {
                        pVVar26 = &local_e8;
                      }
                      uVar47 = *(uint *)((long)&pVVar26->colors + (long)pVVar43 * 4);
                      uVar53 = (int)uVar40 - uVar47;
                      uVar41 = (ulong)uVar53;
                      if ((-1 < (int)uVar53) && (argb[uVar53] == argb[uVar40])) {
                        uVar53 = 0;
                        uVar51 = uVar40 & 0xffffffff;
                        while( true ) {
                          uVar2 = *(ushort *)((long)ptr + uVar41 * 2);
                          uVar1 = *(ushort *)((long)ptr + uVar51 * 2);
                          uVar35 = (uint)uVar2;
                          if (uVar2 != uVar1) break;
                          uVar53 = uVar53 + uVar35;
                          if (((0xfff < uVar53) ||
                              (uVar42 = (int)uVar51 + uVar35, uVar51 = (ulong)uVar42,
                              (int)uVar31 <= (int)uVar42)) ||
                             (uVar41 = (ulong)((int)uVar41 + uVar35), argb[uVar41] != argb[uVar51]))
                          goto LAB_00146b24;
                        }
                        if (uVar1 <= uVar2) {
                          uVar35 = (uint)uVar1;
                        }
                        uVar53 = uVar53 + uVar35;
LAB_00146b24:
                        if (((int)uVar44 < (int)uVar53) &&
                           (uVar44 = uVar53, uVar23 = uVar47, 0xffe < uVar53)) {
                          uVar44 = 0xfff;
                          goto LAB_00146b8f;
                        }
                      }
                      uVar47 = uVar23;
                      pVVar43 = (VP8LBackwardRefs *)((long)&pVVar43->block_size + 1);
                      uVar23 = uVar47;
                    } while (pVVar43 != pVVar36);
                  }
                  uVar53 = 0;
                  uVar45 = 0;
                  uVar23 = 0;
                  if (4 < (int)uVar44) {
LAB_00146b8f:
                    uVar53 = uVar47 << 0xc | uVar44;
                    uVar45 = uVar44;
                    uVar23 = uVar47;
                  }
                  puVar48[uVar40] = uVar53;
                  uVar40 = uVar40 + 1;
                  local_1f8 = pVVar38;
                } while (uVar40 != uVar31);
              }
              *puVar48 = 0;
              WebPSafeFree(ptr);
              iVar21 = (int)&local_248;
              goto LAB_00146be0;
            }
            uVar23 = 0;
          }
          else {
            if (uVar34 != 2) goto LAB_00147566;
            if (refs_00->tail != (PixOrCopyBlock **)0x0) {
              *refs_00->tail = refs_00->free_blocks;
            }
            refs_00->free_blocks = refs_00->refs;
            refs_00->tail = ppPVar32;
            refs_00->last_block = (PixOrCopyBlock *)0x0;
            refs_00->refs = (PixOrCopyBlock *)0x0;
            VP8LBackwardRefsCursorAdd(refs_00,(PixOrCopy)((ulong)*argb << 0x20 | 0x10000));
            if (1 < (int)uVar31) {
              uVar40 = 1;
              do {
                iVar22 = (int)uVar40;
                iVar21 = uVar31 - iVar22;
                if (0xffe < (int)(uVar31 - iVar22)) {
                  iVar21 = 0xfff;
                }
                puVar48 = argb + uVar40;
                iVar18 = 0;
                if (*puVar48 == puVar48[-1]) {
                  iVar18 = (*VP8LVectorMismatch)(puVar48,argb + (uVar40 - 1),iVar21);
                }
                iVar19 = 0;
                if ((width <= iVar22) && (*puVar48 == puVar48[local_1e8])) {
                  iVar19 = (*VP8LVectorMismatch)(puVar48,puVar48 + local_1e8,iVar21);
                }
                if ((iVar18 < 4) || (iVar18 < iVar19)) {
                  if (iVar19 < 4) {
                    v = (PixOrCopy)((ulong)*puVar48 << 0x20 | 0x10000);
                    iVar19 = 1;
                  }
                  else {
                    v = (PixOrCopy)(local_1a8 + (ulong)(uint)(iVar19 << 0x10) + 2);
                  }
                }
                else {
                  v = (PixOrCopy)((ulong)(uint)(iVar18 << 0x10) | 0x100000002);
                  iVar19 = iVar18;
                }
                VP8LBackwardRefsCursorAdd(refs_00,v);
                uVar40 = (ulong)(uint)(iVar22 + iVar19);
              } while (iVar22 + iVar19 < (int)uVar31);
            }
            uVar23 = (uint)(refs_00->error == 0);
          }
          if (uVar23 == 0) goto LAB_00147566;
          puVar48 = (uint32_t *)0x1;
          uVar27 = 0;
          do {
            uVar40 = (ulong)local_258[3];
            if (puVar48 == (uint32_t *)0x1) {
              uVar40 = 0;
            }
            iVar21 = (int)uVar40;
            puVar49 = puVar48;
            if (puVar48 != (uint32_t *)0x1 || do_no_cache != 0) {
              local_228 = puVar48;
              if (puVar48 == (uint32_t *)0x0) {
                auStack_48 = SUB1612((undefined1  [16])0x0,4);
                auStack_58 = SUB1612((undefined1  [16])0x0,0);
                local_4c = 0;
                local_68 = (undefined1  [16])0x0;
                local_290 = *ppPVar32;
                if (local_290 == (PixOrCopyBlock *)0x0) {
                  pPVar50 = (PixOrCopy *)0x0;
                  local_278 = (PixOrCopy *)0x0;
                }
                else {
                  pPVar50 = local_290->start;
                  local_278 = pPVar50 + local_290->size;
                }
                local_a8 = (undefined1  [16])0x0;
                local_b8 = (undefined1  [16])0x0;
                local_c8 = (undefined1  [16])0x0;
                local_d8 = (undefined1  [16])0x0;
                local_e8.colors = (uint32_t *)0x0;
                local_e8.hash_shift = 0;
                local_e8.hash_bits = 0;
                auVar13._8_8_ = 0;
                auVar13._0_8_ = local_98._8_8_;
                local_98 = auVar13 << 0x40;
                if (iVar17 == 0) {
                  iVar21 = 0;
                }
                else {
                  if (-1 < iVar17) {
                    pVVar26 = &local_198;
                    uVar41 = 0;
                    do {
                      iVar22 = (int)uVar41;
                      pVVar28 = VP8LAllocateHistogram(iVar22);
                      (&local_e8.colors)[uVar41] = (uint32_t *)pVVar28;
                      bVar58 = true;
                      if (pVVar28 == (VP8LHistogram *)0x0) goto LAB_0014710f;
                      VP8LHistogramInit(pVVar28,iVar22,1);
                      if (uVar41 != 0) {
                        iVar22 = VP8LColorCacheInit(pVVar26,iVar22);
                        *(int *)(local_68 + uVar41 * 4) = iVar22;
                        if (iVar22 == 0) goto LAB_0014710f;
                      }
                      uVar41 = uVar41 + 1;
                      pVVar26 = pVVar26 + 1;
                    } while (uVar24 != uVar41);
                  }
                  if (pPVar50 != (PixOrCopy *)0x0) {
                    puVar48 = argb;
                    do {
                      if (pPVar50->mode == '\0') {
                        uVar23 = *puVar48;
                        puVar48 = puVar48 + 1;
                        pVVar46 = (VP8LBackwardRefs *)(ulong)(uVar23 >> 8 & 0xff);
                        local_e8.colors[(ulong)(uVar23 & 0xff) + 0x102] =
                             local_e8.colors[(ulong)(uVar23 & 0xff) + 0x102] + 1;
                        piVar54 = (int *)(*(long *)local_e8.colors + (long)pVVar46 * 4);
                        *piVar54 = *piVar54 + 1;
                        uVar41 = (ulong)(uVar23 >> 0x10 & 0xff);
                        local_e8.colors[uVar41 + 2] = local_e8.colors[uVar41 + 2] + 1;
                        local_e8.colors[(ulong)(uVar23 >> 0x18) + 0x202] =
                             local_e8.colors[(ulong)(uVar23 >> 0x18) + 0x202] + 1;
                        if (0 < iVar17) {
                          uVar45 = uVar23 * 0x1e35a7bd >> ((byte)local_258[2] & 0x1f);
                          pVVar26 = &local_198 + uVar56;
                          pVVar38 = local_1e0;
                          do {
                            if (pVVar26->colors[uVar45] == uVar23) {
                              piVar54 = (int *)(*(long *)(&lStack_f0)[(long)pVVar38] + 0x460 +
                                               (long)(int)uVar45 * 4);
                            }
                            else {
                              pVVar26->colors[uVar45] = uVar23;
                              plVar6 = (long *)(&lStack_f0)[(long)pVVar38];
                              piVar54 = (int *)((long)plVar6 + (ulong)(uVar23 & 0xff) * 4 + 0x408);
                              *piVar54 = *piVar54 + 1;
                              piVar54 = (int *)(*plVar6 + (long)pVVar46 * 4);
                              *piVar54 = *piVar54 + 1;
                              piVar54 = (int *)((long)plVar6 + uVar41 * 4 + 8);
                              *piVar54 = *piVar54 + 1;
                              piVar54 = (int *)((long)plVar6 + (ulong)(uVar23 >> 0x18) * 4 + 0x808);
                            }
                            *piVar54 = *piVar54 + 1;
                            uVar45 = (int)uVar45 >> 1;
                            pVVar38 = (VP8LBackwardRefs *)((long)&pVVar38[-1].last_block + 7);
                            pVVar26 = pVVar26 + -1;
                          } while (1 < (long)pVVar38);
                        }
                      }
                      else {
                        uVar2 = pPVar50->len;
                        uVar23 = (uint)uVar2;
                        if (uVar2 < 0x200) {
                          uVar45 = (uint)kPrefixEncodeCode[(uint)uVar2].code;
                        }
                        else {
                          uVar47 = uVar2 - 1;
                          uVar45 = 0x1f;
                          if (uVar47 != 0) {
                            for (; uVar47 >> uVar45 == 0; uVar45 = uVar45 - 1) {
                            }
                          }
                          bVar58 = (uVar47 >> ((byte)(0x1e - (char)(uVar45 ^ 0x1f)) & 0x1f) & 1) !=
                                   0;
                          pVVar46 = (VP8LBackwardRefs *)(ulong)bVar58;
                          uVar45 = (uint)bVar58 + (uVar45 ^ 0x1f) * 2 ^ 0x3e;
                        }
                        uVar47 = *puVar48;
                        if (-1 < iVar17) {
                          uVar41 = 0;
                          do {
                            pVVar46 = *(VP8LBackwardRefs **)(&local_e8.colors)[uVar41];
                            piVar54 = (int *)((long)&pVVar46[0x19].free_blocks +
                                             (long)(int)uVar45 * 4);
                            *piVar54 = *piVar54 + 1;
                            uVar41 = uVar41 + 1;
                          } while (uVar24 != uVar41);
                        }
                        uVar45 = ~uVar47;
                        do {
                          uVar47 = *puVar48;
                          if ((0 < iVar17) && (uVar47 != uVar45)) {
                            uVar45 = uVar47 * 0x1e35a7bd >> ((byte)local_258[2] & 0x1f);
                            pVVar26 = &local_198 + uVar56;
                            pVVar46 = local_1e0;
                            do {
                              pVVar26->colors[(int)uVar45] = uVar47;
                              uVar45 = (int)uVar45 >> 1;
                              pVVar46 = (VP8LBackwardRefs *)((long)&pVVar46[-1].last_block + 7);
                              pVVar26 = pVVar26 + -1;
                            } while (1 < (long)pVVar46);
                          }
                          puVar48 = puVar48 + 1;
                          uVar23 = uVar23 - 1;
                          uVar45 = uVar47;
                        } while (uVar23 != 0);
                      }
                      pPVar50 = pPVar50 + 1;
                      if (pPVar50 == local_278) {
                        local_290 = local_290->next;
                        if (local_290 == (PixOrCopyBlock *)0x0) break;
                        pPVar50 = local_290->start;
                        local_278 = pPVar50 + local_290->size;
                      }
                    } while (pPVar50 != (PixOrCopy *)0x0);
                  }
                  if (-1 < iVar17) {
                    uVar51 = 0;
                    uVar41 = 0xffffffffffffffff;
                    do {
                      uVar29 = VP8LHistogramEstimateBits
                                         ((VP8LHistogram *)(&local_e8.colors)[uVar51]);
                      uVar39 = uVar51 & 0xffffffff;
                      if (uVar41 <= uVar29 && uVar51 != 0) {
                        uVar29 = uVar41;
                        uVar39 = uVar40;
                      }
                      iVar21 = (int)uVar39;
                      uVar51 = uVar51 + 1;
                      uVar41 = uVar29;
                      uVar40 = uVar39;
                    } while (uVar24 != uVar51);
                    bVar58 = false;
LAB_0014710f:
                    if (-1 < iVar17) {
                      pVVar26 = &local_198;
                      uVar40 = 0;
                      do {
                        if (*(int *)(local_68 + uVar40 * 4) != 0) {
                          VP8LColorCacheClear(pVVar26);
                        }
                        VP8LFreeHistogram((VP8LHistogram *)(&local_e8.colors)[uVar40]);
                        uVar40 = uVar40 + 1;
                        pVVar26 = pVVar26 + 1;
                      } while (uVar24 != uVar40);
                    }
                    if (bVar58) goto LAB_00147566;
                  }
                }
                if (0 < iVar21) {
                  pPVar57 = *ppPVar32;
                  if (pPVar57 == (PixOrCopyBlock *)0x0) {
                    iVar22 = VP8LColorCacheInit(&local_198,iVar21);
                    if (iVar22 == 0) goto LAB_00147566;
                  }
                  else {
                    pPVar50 = pPVar57->start;
                    iVar22 = pPVar57->size;
                    iVar18 = VP8LColorCacheInit(&local_198,iVar21);
                    if (iVar18 == 0) goto LAB_00147566;
                    if (pPVar50 != (PixOrCopy *)0x0) {
                      pPVar37 = pPVar50 + iVar22;
                      iVar22 = 0;
                      do {
                        if (pPVar50->mode == '\0') {
                          uVar3 = pPVar50->argb_or_distance;
                          uVar45 = uVar3 * 0x1e35a7bd >> ((byte)local_198.hash_shift & 0x1f);
                          uVar23 = 0xffffffff;
                          if (local_198.colors[(int)uVar45] == uVar3) {
                            uVar23 = uVar45;
                          }
                          if ((int)uVar23 < 0) {
                            local_198.colors[(int)uVar45] = uVar3;
                          }
                          else {
                            *pPVar50 = (PixOrCopy)((ulong)uVar23 << 0x20 | 0x10001);
                          }
                          iVar22 = iVar22 + 1;
                        }
                        else {
                          uVar2 = pPVar50->len;
                          if (uVar2 != 0) {
                            pVVar46 = (VP8LBackwardRefs *)(argb + iVar22);
                            lVar52 = 0;
                            do {
                              local_198.colors
                              [(int)((uint)((&pVVar46->block_size)[lVar52] * 0x1e35a7bd) >>
                                    ((byte)local_198.hash_shift & 0x1f))] =
                                   (&pVVar46->block_size)[lVar52];
                              lVar52 = lVar52 + 1;
                            } while ((uint)uVar2 != (uint)lVar52);
                            iVar22 = iVar22 + (uint)lVar52;
                          }
                        }
                        pPVar50 = pPVar50 + 1;
                        if (pPVar50 == pPVar37) {
                          pPVar57 = pPVar57->next;
                          if (pPVar57 == (PixOrCopyBlock *)0x0) break;
                          pPVar50 = pPVar57->start;
                          pPVar37 = pPVar50 + pPVar57->size;
                        }
                      } while (pPVar50 != (PixOrCopy *)0x0);
                    }
                  }
                  VP8LColorCacheClear(&local_198);
                }
                if ((do_no_cache == 0) || (iVar22 = 0, iVar21 != 0)) goto LAB_00146c37;
              }
              else {
LAB_00146c37:
                iVar22 = iVar21;
                pVVar28 = local_230;
                VP8LHistogramCreate(local_230,refs_00,iVar22);
                uVar27 = VP8LHistogramEstimateBits(pVVar28);
              }
              puVar49 = local_228;
              if (uVar27 < *(ulong *)(&local_1d8 + (long)local_228 * 2)) {
                if (local_228 == (uint32_t *)0x1) {
                  iVar21 = BackwardRefsClone((VP8LBackwardRefs *)*ppPVar32,local_1a0);
                  if (iVar21 == 0) goto LAB_00147566;
                  *(uint64_t *)(&local_1d8 + (long)local_228 * 2) = uVar27;
                  local_258[1] = uVar34;
                  puVar49 = local_228;
                }
                else {
                  ppPVar4 = refs_00->tail;
                  ppPVar5 = refs->tail;
                  pPVar57 = refs_00->last_block;
                  local_178._0_8_ = pPVar57;
                  iVar19 = refs_00->block_size;
                  iVar20 = refs_00->error;
                  pPVar8 = refs_00->refs;
                  ppPVar9 = refs_00->tail;
                  pPVar10 = refs_00->free_blocks;
                  local_188._0_8_ = refs_00->tail;
                  local_188._8_8_ = refs_00->free_blocks;
                  local_198 = *(VP8LColorCache *)refs_00;
                  refs_00->last_block = refs->last_block;
                  iVar21 = refs->block_size;
                  iVar18 = refs->error;
                  pPVar11 = refs->refs;
                  pPVar12 = refs->free_blocks;
                  refs_00->tail = refs->tail;
                  refs_00->free_blocks = pPVar12;
                  refs_00->block_size = iVar21;
                  refs_00->error = iVar18;
                  refs_00->refs = pPVar11;
                  refs->last_block = pPVar57;
                  refs->tail = ppPVar9;
                  refs->free_blocks = pPVar10;
                  refs->block_size = iVar19;
                  refs->error = iVar20;
                  refs->refs = pPVar8;
                  if (ppPVar5 == local_1f0 && ppPVar5 != (PixOrCopyBlock **)0x0) {
                    refs_00->tail = ppPVar32;
                  }
                  if (ppPVar4 != (PixOrCopyBlock **)0x0 && ppPVar4 == ppPVar32) {
                    refs->tail = local_1f0;
                  }
                  *(uint64_t *)(&local_1d8 + (long)local_228 * 2) = uVar27;
                  local_258[(long)local_228] = uVar34;
                  pVVar46 = refs_00;
                  if (puVar49 == (uint32_t *)0x0) {
                    *local_218 = iVar22;
                    break;
                  }
                }
              }
            }
            puVar48 = (uint32_t *)((long)puVar49 + -1);
          } while (puVar49 != (uint32_t *)0x0);
        }
        uVar23 = ~uVar34;
        uVar34 = uVar34 * 2;
        lz77_types_to_try = local_20c & uVar23;
      } while (lz77_types_to_try != 0);
      local_260 = SUB84(local_258._0_8_,4);
      uVar31 = local_258[0];
    }
    pVVar28 = local_230;
    lVar55 = 2;
    lVar52 = 0;
    do {
      if (do_no_cache != 0 || lVar52 != 0) {
        iVar17 = *(int *)((long)local_258 + lVar55 * 2);
        if (iVar17 == 1) {
          hash_chain_00 = local_220;
          if (0x18 < quality) {
LAB_0014739c:
            if (lVar52 == 0) {
              iVar17 = 0;
            }
            else {
              iVar17 = *local_218;
            }
            pVVar46 = (VP8LBackwardRefs *)((long)&refs[1].block_size + lVar52);
            iVar21 = VP8LBackwardReferencesTraceBackwards
                               (width,height,argb,iVar17,hash_chain_00,pVVar46,refs_00);
            if (iVar21 == 0) goto LAB_00147566;
            VP8LHistogramCreate(pVVar28,refs_00,iVar17);
            uVar27 = VP8LHistogramEstimateBits(pVVar28);
            if (uVar27 < *(ulong *)(&local_1d8 + lVar55)) {
              ppPVar32 = refs_00->tail;
              lVar30 = (long)&refs[1].refs + lVar52;
              lVar7 = *(long *)((long)&refs[1].tail + lVar52);
              pPVar57 = refs_00->last_block;
              local_178._0_8_ = pPVar57;
              iVar22 = refs_00->block_size;
              iVar18 = refs_00->error;
              pPVar8 = refs_00->refs;
              local_198 = *(VP8LColorCache *)refs_00;
              ppPVar4 = refs_00->tail;
              pPVar10 = refs_00->free_blocks;
              local_188._0_8_ = refs_00->tail;
              local_188._8_8_ = refs_00->free_blocks;
              refs_00->last_block = *(PixOrCopyBlock **)((long)&refs[1].last_block + lVar52);
              iVar17 = pVVar46->block_size;
              iVar21 = pVVar46->error;
              pPVar11 = *(PixOrCopyBlock **)((long)&refs[1].refs + lVar52);
              pPVar12 = *(PixOrCopyBlock **)((long)&refs[1].free_blocks + lVar52);
              refs_00->tail = *(PixOrCopyBlock ***)((long)&refs[1].tail + lVar52);
              refs_00->free_blocks = pPVar12;
              refs_00->block_size = iVar17;
              refs_00->error = iVar21;
              refs_00->refs = pPVar11;
              *(PixOrCopyBlock **)((long)&refs[1].last_block + lVar52) = pPVar57;
              *(PixOrCopyBlock ***)((long)&refs[1].tail + lVar52) = ppPVar4;
              *(PixOrCopyBlock **)((long)&refs[1].free_blocks + lVar52) = pPVar10;
              pVVar46->block_size = iVar22;
              pVVar46->error = iVar18;
              *(PixOrCopyBlock **)((long)&refs[1].refs + lVar52) = pPVar8;
              if (lVar30 == lVar7 && lVar7 != 0) {
                refs_00->tail = &refs_00->refs;
              }
              if (ppPVar32 != (PixOrCopyBlock **)0x0 && ppPVar32 == &refs_00->refs) {
                *(long *)((long)&refs[1].tail + lVar52) = lVar30;
              }
            }
          }
        }
        else if ((0x18 < quality) && (hash_chain_00 = &local_248, iVar17 == 4)) goto LAB_0014739c;
        BackwardReferences2DLocality(width,*(VP8LBackwardRefs **)((long)&refs[1].refs + lVar52));
        if (((lVar52 == 0) && (uVar31 == local_260)) && (*local_218 == 0)) {
          iVar17 = BackwardRefsClone((VP8LBackwardRefs *)refs[1].refs,refs);
          if (iVar17 == 0) goto LAB_00147566;
          break;
        }
      }
      lVar55 = lVar55 + -2;
      lVar52 = lVar52 + -0x28;
    } while (lVar52 != -0x50);
    WebPSafeFree(local_248.offset_length);
    local_248.size = 0;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = local_248._8_8_;
    local_248 = (VP8LHashChain)(auVar14 << 0x40);
    VP8LFreeHistogram(local_230);
    pic = local_200;
    percent = local_1b0;
    percent_range = local_210;
  }
  else {
    *cache_bits_best = 0;
    iVar17 = BackwardReferencesLz77(width,height,argb,(int)hash_chain,(VP8LHashChain *)refs,pVVar46)
    ;
    if (iVar17 == 0) {
      iVar17 = WebPEncodingSetError(pic,VP8_ENC_ERROR_OUT_OF_MEMORY);
      return iVar17;
    }
    BackwardReferences2DLocality(width,(VP8LBackwardRefs *)refs->refs);
  }
  iVar17 = WebPReportProgress(pic,percent_range + *percent,percent);
  return iVar17;
}

Assistant:

int VP8LGetBackwardReferences(
    int width, int height, const uint32_t* const argb, int quality,
    int low_effort, int lz77_types_to_try, int cache_bits_max, int do_no_cache,
    const VP8LHashChain* const hash_chain, VP8LBackwardRefs* const refs,
    int* const cache_bits_best, const WebPPicture* const pic, int percent_range,
    int* const percent) {
  if (low_effort) {
    VP8LBackwardRefs* refs_best;
    *cache_bits_best = cache_bits_max;
    refs_best = GetBackwardReferencesLowEffort(
        width, height, argb, cache_bits_best, hash_chain, refs);
    if (refs_best == NULL) {
      return WebPEncodingSetError(pic, VP8_ENC_ERROR_OUT_OF_MEMORY);
    }
    // Set it in first position.
    BackwardRefsSwap(refs_best, &refs[0]);
  } else {
    if (!GetBackwardReferences(width, height, argb, quality, lz77_types_to_try,
                               cache_bits_max, do_no_cache, hash_chain, refs,
                               cache_bits_best)) {
      return WebPEncodingSetError(pic, VP8_ENC_ERROR_OUT_OF_MEMORY);
    }
  }

  return WebPReportProgress(pic, *percent + percent_range, percent);
}